

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

VarValue *
deqp::gles2::Functional::generateZeroVarValue(VarValue *__return_storage_ptr__,DataType type)

{
  bool bVar1;
  int iVar2;
  int local_20;
  int local_1c;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int numElems;
  DataType type_local;
  
  iVar2 = glu::getDataTypeScalarSize(type);
  __return_storage_ptr__->type = type;
  bVar1 = glu::isDataTypeFloatOrVec(type);
  if ((bVar1) || (bVar1 = glu::isDataTypeMatrix(type), bVar1)) {
    for (i_2 = 0; i_2 < iVar2; i_2 = i_2 + 1) {
      *(undefined4 *)((long)&__return_storage_ptr__->val + (long)i_2 * 4) = 0;
    }
  }
  else {
    bVar1 = glu::isDataTypeIntOrIVec(type);
    if (bVar1) {
      for (i_3 = 0; i_3 < iVar2; i_3 = i_3 + 1) {
        *(undefined4 *)((long)&__return_storage_ptr__->val + (long)i_3 * 4) = 0;
      }
    }
    else {
      bVar1 = glu::isDataTypeBoolOrBVec(type);
      if (bVar1) {
        for (local_1c = 0; local_1c < iVar2; local_1c = local_1c + 1) {
          (__return_storage_ptr__->val).boolV[local_1c] = false;
        }
      }
      else {
        bVar1 = glu::isDataTypeSampler(type);
        if (bVar1) {
          (__return_storage_ptr__->val).floatV[0] = 0.0;
          for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
            *(float *)((long)&__return_storage_ptr__->val + (long)local_20 * 4 + 4) =
                 (float)local_20 * 0.12;
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static VarValue generateZeroVarValue (const glu::DataType type)
{
	const int	numElems = glu::getDataTypeScalarSize(type);
	VarValue	result;
	result.type = type;

	if (glu::isDataTypeFloatOrVec(type) || glu::isDataTypeMatrix(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.floatV[i] = 0.0f;
	}
	else if (glu::isDataTypeIntOrIVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.intV[i] = 0;
	}
	else if (glu::isDataTypeBoolOrBVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.boolV[i] = false;
	}
	else if (glu::isDataTypeSampler(type))
	{
		result.val.samplerV.unit = 0;

		for (int i = 0; i < 4; i++)
			result.val.samplerV.fillColor[i] = 0.12f * (float)i;
	}
	else
		DE_ASSERT(false);

	return result;
}